

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCGeometry.cpp
# Opt level: O1

bool __thiscall
Assimp::IFC::ProcessRepresentationItem
          (IFC *this,IfcRepresentationItem *item,uint matid,
          set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *mesh_indices,
          ConversionData *conv)

{
  bool bVar1;
  uint matid_00;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_00;
  undefined4 in_register_00000014;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  *__x;
  bool bVar2;
  key_type local_38;
  
  __x = (_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
         *)CONCAT44(in_register_00000014,matid);
  matid_00 = ProcessMaterials(*(uint64_t *)(this + *(long *)(*(long *)this + -0x18) + 8),(uint)item,
                              (ConversionData *)mesh_indices,true);
  bVar1 = TryQueryMeshCache(this,(IfcRepresentationItem *)__x,
                            (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)(ulong)matid_00,(uint)mesh_indices,conv);
  bVar2 = true;
  if (!bVar1) {
    bVar1 = ProcessGeometricItem
                      ((IfcRepresentationItem *)this,matid_00,
                       (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       __x,(ConversionData *)mesh_indices);
    if (bVar1) {
      if ((__x->_M_impl).super__Rb_tree_header._M_node_count != 0) {
        local_38.item = (IfcRepresentationItem *)this;
        local_38.matindex = matid_00;
        this_00 = &std::
                   map<Assimp::IFC::ConversionData::MeshCacheIndex,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<Assimp::IFC::ConversionData::MeshCacheIndex>,_std::allocator<std::pair<const_Assimp::IFC::ConversionData::MeshCacheIndex,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                   ::operator[]((map<Assimp::IFC::ConversionData::MeshCacheIndex,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<Assimp::IFC::ConversionData::MeshCacheIndex>,_std::allocator<std::pair<const_Assimp::IFC::ConversionData::MeshCacheIndex,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                                 *)&mesh_indices[4]._M_t._M_impl.super__Rb_tree_header._M_header.
                                    _M_right,&local_38)->_M_t;
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::operator=(this_00,__x);
      }
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool ProcessRepresentationItem(const Schema_2x3::IfcRepresentationItem& item, unsigned int matid,
    std::set<unsigned int>& mesh_indices,
    ConversionData& conv)
{
    // determine material
    unsigned int localmatid = ProcessMaterials(item.GetID(), matid, conv, true);

    if (!TryQueryMeshCache(item,mesh_indices,localmatid,conv)) {
        if(ProcessGeometricItem(item,localmatid,mesh_indices,conv)) {
            if(mesh_indices.size()) {
                PopulateMeshCache(item,mesh_indices,localmatid,conv);
            }
        }
        else return false;
    }
    return true;
}